

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O3

bool testing::internal::UnitTestOptions::MatchesFilter(string *name,char *filter)

{
  char *str;
  bool bVar1;
  char *pcVar2;
  bool bVar3;
  
  str = (name->_M_dataplus)._M_p;
  bVar1 = PatternMatchesString(filter,str);
  bVar3 = true;
  while( true ) {
    if (bVar1 != false) {
      return bVar3;
    }
    pcVar2 = strchr(filter,0x3a);
    bVar3 = pcVar2 != (char *)0x0;
    if (pcVar2 == (char *)0x0) break;
    filter = pcVar2 + 1;
    bVar1 = PatternMatchesString(filter,str);
  }
  return bVar3;
}

Assistant:

bool UnitTestOptions::MatchesFilter(
    const std::string& name, const char* filter) {
  const char *cur_pattern = filter;
  for (;;) {
    if (PatternMatchesString(cur_pattern, name.c_str())) {
      return true;
    }

    // Finds the next pattern in the filter.
    cur_pattern = strchr(cur_pattern, ':');

    // Returns if no more pattern can be found.
    if (cur_pattern == NULL) {
      return false;
    }

    // Skips the pattern separater (the ':' character).
    cur_pattern++;
  }
}